

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_int>::decodeArray
          (FastPForImpl<8U,_unsigned_int> *this,uint32_t *in,size_t length,uint *out,size_t *nvalue)

{
  undefined8 uVar1;
  ulong uVar2;
  logic_error *this_00;
  ulong in_RCX;
  long in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  ulong *in_R8;
  size_t thissize;
  size_t thisnvalue;
  uint *finalout;
  size_t mynvalue;
  uint32_t *initin;
  size_t in_stack_00000130;
  uint *in_stack_00000138;
  size_t *in_stack_00000140;
  uint32_t *in_stack_00000148;
  FastPForImpl<8U,_unsigned_int> *in_stack_00000150;
  size_t in_stack_ffffffffffffff78;
  NotEnoughStorage *in_stack_ffffffffffffff80;
  FastPForImpl<8U,_unsigned_int> *local_78;
  FastPForImpl<8U,_unsigned_int> *in_stack_ffffffffffffffa0;
  ulong local_20;
  
  if (*in_R8 < (ulong)*in_RSI) {
    uVar1 = __cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __cxa_throw(uVar1,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  *in_R8 = (ulong)*in_RSI;
  uVar2 = in_RCX + *in_R8 * 4;
  for (local_20 = in_RCX; local_20 != uVar2; local_20 = (long)local_78 * 4 + local_20) {
    if (local_20 + (ulong)*in_RDI * 4 < uVar2) {
      local_78 = (FastPForImpl<8U,_unsigned_int> *)(ulong)*in_RDI;
    }
    else {
      local_78 = (FastPForImpl<8U,_unsigned_int> *)((long)(uVar2 - local_20) >> 2);
    }
    __decodeArray(in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
                  in_stack_00000130);
    in_stack_ffffffffffffffa0 = local_78;
  }
  if (in_RSI + in_RDX < in_RSI + 1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Decode run over output buffer. Potential buffer overflow!");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  resetBuffer(in_stack_ffffffffffffffa0);
  return in_RSI + 1;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              IntType *out, size_t &nvalue) {
    const uint32_t *const initin(in);
    const size_t mynvalue = *in;
    ++in;
    if (mynvalue > nvalue) throw NotEnoughStorage(mynvalue);
    nvalue = mynvalue;
    const IntType *const finalout(out + nvalue);
    while (out != finalout) {
      size_t thisnvalue(0);
      size_t thissize = static_cast<size_t>(
          finalout > PageSize + out ? PageSize : (finalout - out));

      __decodeArray(in, thisnvalue, out, thissize);
      in += thisnvalue;
      out += thissize;
    }

    if (initin + length < in) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }

    resetBuffer();  // if you don't do this, the codec has a "memory".
    return in;
  }